

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O0

void cb_template_submit(Fl_Return_Button *param_1,void *param_2)

{
  Fl_Shared_Image *this;
  Fl_Shared_Image *img;
  void *param_1_local;
  Fl_Return_Button *param_0_local;
  
  this = (Fl_Shared_Image *)Fl_Widget::image(&template_preview->super_Fl_Widget);
  if (this != (Fl_Shared_Image *)0x0) {
    Fl_Shared_Image::release(this);
  }
  Fl_Widget::image(&template_preview->super_Fl_Widget,(Fl_Image *)0x0);
  (*(template_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return;
}

Assistant:

static void cb_template_submit(Fl_Return_Button*, void*) {
  Fl_Shared_Image *img = (Fl_Shared_Image *)template_preview->image();
if (img) img->release();
template_preview->image(0);

template_panel->hide();
}